

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# handle_custom_notification.cxx
# Opt level: O3

ptr<resp_msg> __thiscall
nuraft::raft_server::handle_leadership_takeover
          (raft_server *this,req_msg *req,ptr<custom_notification_msg> msg,ptr<resp_msg> *resp)

{
  pointer psVar1;
  element_type *peVar2;
  element_type *peVar3;
  int iVar4;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_01;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_02;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_03;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var5;
  ptr<resp_msg> pVar6;
  string local_48;
  
  if ((*(int *)((long)&req->commit_idx_ + 4) ==
       *(int *)&(req->log_entries_).
                super__Vector_base<std::shared_ptr<nuraft::log_entry>,_std::allocator<std::shared_ptr<nuraft::log_entry>_>_>
                ._M_impl.super__Vector_impl_data._M_start) &&
     (*(int *)&req[8].log_entries_.
               super__Vector_base<std::shared_ptr<nuraft::log_entry>,_std::allocator<std::shared_ptr<nuraft::log_entry>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage == 3)) {
    psVar1 = req[9].log_entries_.
             super__Vector_base<std::shared_ptr<nuraft::log_entry>,_std::allocator<std::shared_ptr<nuraft::log_entry>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
    _Var5._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                  msg.
                  super___shared_ptr<nuraft::custom_notification_msg,_(__gnu_cxx::_Lock_policy)2>.
                  _M_ptr;
    if (psVar1 != (pointer)0x0) {
      iVar4 = (*(code *)(psVar1->super___shared_ptr<nuraft::log_entry,_(__gnu_cxx::_Lock_policy)2>).
                        _M_ptr[1].buff_.
                        super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr)();
      _Var5._M_pi = extraout_RDX;
      if (1 < iVar4) {
        psVar1 = req[9].log_entries_.
                 super__Vector_base<std::shared_ptr<nuraft::log_entry>,_std::allocator<std::shared_ptr<nuraft::log_entry>_>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage;
        msg_if_given_abi_cxx11_
                  (&local_48,"got leadership takeover request from peer %d, I\'m already a leader",
                   (ulong)*(uint *)((long)&((msg.
                                             super___shared_ptr<nuraft::custom_notification_msg,_(__gnu_cxx::_Lock_policy)2>
                                            ._M_ptr)->ctx_).
                                           super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>
                                           ._M_refcount._M_pi + 4));
        (*(code *)(psVar1->super___shared_ptr<nuraft::log_entry,_(__gnu_cxx::_Lock_policy)2>)._M_ptr
                  [1].buff_.super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi)
                  (psVar1,2,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_custom_notification.cxx"
                   ,"handle_leadership_takeover",0xd9,&local_48);
        _Var5._M_pi = extraout_RDX_00;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_48._M_dataplus._M_p != &local_48.field_2) {
          operator_delete(local_48._M_dataplus._M_p);
          _Var5._M_pi = extraout_RDX_01;
        }
      }
    }
  }
  else {
    psVar1 = req[9].log_entries_.
             super__Vector_base<std::shared_ptr<nuraft::log_entry>,_std::allocator<std::shared_ptr<nuraft::log_entry>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
    if (psVar1 != (pointer)0x0) {
      iVar4 = (*(code *)(psVar1->super___shared_ptr<nuraft::log_entry,_(__gnu_cxx::_Lock_policy)2>).
                        _M_ptr[1].buff_.
                        super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr)();
      if (3 < iVar4) {
        psVar1 = req[9].log_entries_.
                 super__Vector_base<std::shared_ptr<nuraft::log_entry>,_std::allocator<std::shared_ptr<nuraft::log_entry>_>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage;
        msg_if_given_abi_cxx11_(&local_48,"[LEADERSHIP TAKEOVER] got request");
        (*(code *)(psVar1->super___shared_ptr<nuraft::log_entry,_(__gnu_cxx::_Lock_policy)2>)._M_ptr
                  [1].buff_.super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi)
                  (psVar1,4,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_custom_notification.cxx"
                   ,"handle_leadership_takeover",0xdc,&local_48);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_48._M_dataplus._M_p != &local_48.field_2) {
          operator_delete(local_48._M_dataplus._M_p);
        }
      }
    }
    initiate_vote((raft_server *)req,true);
    _Var5._M_pi = extraout_RDX_02;
    if (*(int *)&req[8].log_entries_.
                 super__Vector_base<std::shared_ptr<nuraft::log_entry>,_std::allocator<std::shared_ptr<nuraft::log_entry>_>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage != 3) {
      restart_election_timer((raft_server *)req);
      _Var5._M_pi = extraout_RDX_03;
    }
  }
  peVar2 = (resp->super___shared_ptr<nuraft::resp_msg,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  peVar3 = (element_type *)
           (resp->super___shared_ptr<nuraft::resp_msg,_(__gnu_cxx::_Lock_policy)2>)._M_refcount.
           _M_pi;
  (resp->super___shared_ptr<nuraft::resp_msg,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  this->_vptr_raft_server = (_func_int **)peVar2;
  (this->super_enable_shared_from_this<nuraft::raft_server>)._M_weak_this.
  super___weak_ptr<nuraft::raft_server,_(__gnu_cxx::_Lock_policy)2>._M_ptr = peVar3;
  (resp->super___shared_ptr<nuraft::resp_msg,_(__gnu_cxx::_Lock_policy)2>)._M_ptr =
       (element_type *)0x0;
  pVar6.super___shared_ptr<nuraft::resp_msg,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var5._M_pi;
  pVar6.super___shared_ptr<nuraft::resp_msg,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (ptr<resp_msg>)pVar6.super___shared_ptr<nuraft::resp_msg,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

ptr<resp_msg> raft_server::handle_leadership_takeover
                           ( req_msg& req,
                             ptr<custom_notification_msg> msg,
                             ptr<resp_msg> resp )
{
    if (is_leader()) {
        p_er("got leadership takeover request from peer %d, "
             "I'm already a leader", req.get_src());
        return resp;
    }
    p_in("[LEADERSHIP TAKEOVER] got request");

    // Initiate force vote (ignoring priority).
    initiate_vote(true);

    // restart the election timer if this is not yet a leader
    if (role_ != srv_role::leader) {
        restart_election_timer();
    }

    return resp;
}